

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void Catch::List(ConfigData *config)

{
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *filters;
  TestCaseInfo *pTVar1;
  bool bVar2;
  int iVar3;
  What WVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined4 extraout_var_00;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  undefined4 extraout_var_01;
  undefined8 *puVar9;
  undefined4 extraout_var_02;
  domain_error *this;
  size_t sVar10;
  char *pcVar11;
  TestCaseInfo *testCase;
  allocator<char> local_1d1;
  ConfigData *local_1d0;
  string local_1c8 [32];
  ostringstream oss;
  string local_1a0 [368];
  
  WVar4 = config->listSpec;
  local_1d0 = config;
  if ((WVar4 & Reports) != None) {
    std::operator<<((ostream *)&std::cout,"Available reports:\n");
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var,iVar3));
    p_Var8 = *(_Rb_tree_node_base **)(lVar6 + 0x18);
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[2])(pIVar5);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x18))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    for (; p_Var8 != (_Rb_tree_node_base *)(lVar6 + 8);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      poVar7 = std::operator<<((ostream *)&std::cout,"\t");
      poVar7 = std::operator<<(poVar7,(string *)(p_Var8 + 1));
      poVar7 = std::operator<<(poVar7,"\n\t\t\'");
      (**(code **)(**(long **)(p_Var8 + 2) + 0x18))((string *)&oss);
      poVar7 = std::operator<<(poVar7,(string *)&oss);
      std::operator<<(poVar7,"\'\n");
      std::__cxx11::string::~string((string *)&oss);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    WVar4 = local_1d0->listSpec;
  }
  if ((WVar4 & Tests) != None) {
    filters = &local_1d0->filters;
    pcVar11 = "Matching test cases:\n";
    if ((local_1d0->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_1d0->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pcVar11 = "All available test cases:\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar11);
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
    puVar9 = (undefined8 *)
             (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))
                       ((long *)CONCAT44(extraout_var_01,iVar3));
    testCase = (TestCaseInfo *)*puVar9;
    pIVar5 = getRegistryHub();
    iVar3 = (*pIVar5->_vptr_IRegistryHub[3])(pIVar5);
    lVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar3) + 0x10))
                      ((long *)CONCAT44(extraout_var_02,iVar3));
    pTVar1 = *(TestCaseInfo **)(lVar6 + 8);
    sVar10 = 0;
    for (; testCase != pTVar1; testCase = testCase + 1) {
      bVar2 = matchesFilters(filters,testCase);
      if (bVar2) {
        sVar10 = sVar10 + 1;
        poVar7 = std::operator<<((ostream *)&std::cout,"\t");
        poVar7 = std::operator<<(poVar7,(string *)&testCase->m_name);
        std::operator<<(poVar7,"\n");
        if ((~local_1d0->listSpec & 6) != 0) {
          poVar7 = std::operator<<((ostream *)&std::cout,"\t\t \'");
          poVar7 = std::operator<<(poVar7,(string *)&testCase->m_description);
          std::operator<<(poVar7,"\'\n");
        }
      }
    }
    _oss = sVar10;
    if ((local_1d0->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (local_1d0->filters).
        super__Vector_base<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>(local_1c8,"test case",&local_1d1);
      std::__cxx11::string::string(local_1a0,local_1c8);
      poVar7 = operator<<((ostream *)&std::cout,(pluralise *)&oss);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>(local_1c8,"matching test case",&local_1d1);
      std::__cxx11::string::string(local_1a0,local_1c8);
      poVar7 = operator<<((ostream *)&std::cout,(pluralise *)&oss);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::__cxx11::string::~string(local_1a0);
    std::__cxx11::string::~string(local_1c8);
  }
  if ((local_1d0->listSpec & All) != None) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  std::operator<<((ostream *)&oss,"Unknown list type");
  this = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this,local_1c8);
  __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

inline void List( const ConfigData& config ) {

        if( config.listSpec & List::Reports ) {
            std::cout << "Available reports:\n";
            IReporterRegistry::FactoryMap::const_iterator it = getRegistryHub().getReporterRegistry().getFactories().begin();
            IReporterRegistry::FactoryMap::const_iterator itEnd = getRegistryHub().getReporterRegistry().getFactories().end();
            for(; it != itEnd; ++it ) {
                // !TBD: consider listAs()
                std::cout << "\t" << it->first << "\n\t\t'" << it->second->getDescription() << "'\n";
            }
            std::cout << std::endl;
        }

        if( config.listSpec & List::Tests ) {
            if( config.filters.empty() )
                std::cout << "All available test cases:\n";
            else
                std::cout << "Matching test cases:\n";
            std::vector<TestCaseInfo>::const_iterator it = getRegistryHub().getTestCaseRegistry().getAllTests().begin();
            std::vector<TestCaseInfo>::const_iterator itEnd = getRegistryHub().getTestCaseRegistry().getAllTests().end();
            std::size_t matchedTests = 0;
            for(; it != itEnd; ++it ) {
                if( matchesFilters( config.filters, *it ) ) {
                    matchedTests++;
                    // !TBD: consider listAs()
                    std::cout << "\t" << it->getName() << "\n";
                    if( ( config.listSpec & List::TestNames ) != List::TestNames )
                        std::cout << "\t\t '" << it->getDescription() << "'\n";
                }
            }
            if( config.filters.empty() )
                std::cout << pluralise( matchedTests, "test case" ) << std::endl;
            else
                std::cout << pluralise( matchedTests, "matching test case" ) << std::endl;
        }

        if( ( config.listSpec & List::All ) == 0 ) {
            std::ostringstream oss;
            oss << "Unknown list type";
            throw std::domain_error( oss.str() );
        }
    }